

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KBO.cpp
# Opt level: O0

void __thiscall Kernel::KBO::KBO(KBO *this,Problem *prb,Options *opts,bool qkbo)

{
  bool bVar1;
  KboAdmissibilityCheck KVar2;
  Options *in_RDX;
  undefined8 *in_RDI;
  Options *unaff_retaddr;
  Problem *in_stack_00000008;
  PrecedenceOrdering *in_stack_00000010;
  DArray<int> *in_stack_00000028;
  Options *in_stack_00000030;
  undefined7 in_stack_00000038;
  _func_void_UserErrorException *in_stack_000001f8;
  KBO *in_stack_00000200;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  unique_ptr<Kernel::KBO::State,_std::default_delete<Kernel::KBO::State>_> *this_00;
  KBO *in_stack_ffffffffffffffd0;
  
  PrecedenceOrdering::PrecedenceOrdering
            (in_stack_00000010,in_stack_00000008,unaff_retaddr,SUB81((ulong)in_RDI >> 0x38,0));
  *in_RDI = &PTR__KBO_0131ed20;
  weightsFromOpts<Kernel::FuncSigTraits>
            ((KBO *)CONCAT17(qkbo,in_stack_00000038),in_stack_00000030,in_stack_00000028);
  this_00 = (unique_ptr<Kernel::KBO::State,_std::default_delete<Kernel::KBO::State>_> *)
            (in_RDI + 0x15);
  ::operator_new(0x40);
  State::State((State *)0x886b45);
  std::unique_ptr<Kernel::KBO::State,std::default_delete<Kernel::KBO::State>>::
  unique_ptr<std::default_delete<Kernel::KBO::State>,void>
            (this_00,(pointer)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  bVar1 = Shell::Options::kboMaxZero(in_RDX);
  if (bVar1) {
    zeroWeightForMaximalFunc(in_stack_ffffffffffffffd0);
  }
  KVar2 = Shell::Options::kboAdmissabilityCheck(in_RDX);
  if (KVar2 == ERROR) {
    checkAdmissibility<void(*)(Lib::UserErrorException)>(in_stack_00000200,in_stack_000001f8);
  }
  else {
    checkAdmissibility<void(*)(Lib::UserErrorException)>(in_stack_00000200,in_stack_000001f8);
  }
  return;
}

Assistant:

KBO::KBO(Problem& prb, const Options& opts, bool qkbo)
 : PrecedenceOrdering(prb, opts, qkbo)
 , _funcWeights(weightsFromOpts<FuncSigTraits>(opts,_functionPrecedences))
#if __KBO__CUSTOM_PREDICATE_WEIGHTS__
 , _predWeights(weightsFromOpts<PredSigTraits>(opts,_predicatePrecedences))
#endif
 , _state(new State())
{
  if (opts.kboMaxZero()) {
    zeroWeightForMaximalFunc();
  }

  if (opts.kboAdmissabilityCheck() == Options::KboAdmissibilityCheck::ERROR)
    checkAdmissibility(throwError);
  else
    checkAdmissibility(warnError);
}